

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

double units::read1To10(string *str,size_t *index)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0x10;
  do {
    iVar1 = *(int *)(&UNK_001a4a48 + lVar3);
    iVar2 = std::__cxx11::string::compare((ulong)str,*index,(char *)(long)iVar1);
    if (iVar2 == 0) {
      *index = (size_t)((char *)(long)iVar1 + *index);
      return *(double *)(&UNK_001a4a50 + lVar3);
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0xe8);
  return NAN;
}

Assistant:

static double read1To10(const std::string& str, size_t& index)
{
    for (const auto& num : lt10) {
        if (str.compare(index, std::get<2>(num), std::get<0>(num)) == 0) {
            index += std::get<2>(num);
            return std::get<1>(num);
        }
    }
    return constants::invalid_conversion;
}